

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O2

void __thiscall flexbuffers::Builder::Write<long>(Builder *this,long val,size_t byte_width)

{
  long local_8;
  
  if (byte_width < 9) {
    local_8 = val;
    WriteBytes(this,&local_8,byte_width);
    return;
  }
  __assert_fail("sizeof(T) >= byte_width",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/flexbuffers.h"
                ,0x5a3,"void flexbuffers::Builder::Write(T, size_t) [T = long]");
}

Assistant:

void Write(T val, size_t byte_width) {
    FLATBUFFERS_ASSERT(sizeof(T) >= byte_width);
    val = flatbuffers::EndianScalar(val);
    WriteBytes(&val, byte_width);
  }